

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

size_t __thiscall llama_context::state_read_data(llama_context *this,llama_io_read_i *io)

{
  bool bVar1;
  int32_t iVar2;
  uint32_t uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  runtime_error *prVar7;
  int *piVar8;
  size_type sVar9;
  uint *puVar10;
  reference pvVar11;
  undefined4 extraout_var;
  llama_io_read_i *in_RSI;
  llama_context *in_RDI;
  uint64_t embd_size;
  uint64_t logits_size;
  int32_t id;
  int32_t i;
  vector<int,_std::allocator<int>_> output_pos;
  int32_t n_outputs;
  string arch_str;
  string cur_arch_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  llm_arch in_stack_fffffffffffffe9c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint uVar12;
  undefined4 in_stack_fffffffffffffeb0;
  uint uVar13;
  int in_stack_fffffffffffffeb4;
  llama_io_read_i *in_stack_fffffffffffffeb8;
  llama_kv_cache_unified *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int32_t iVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  ulong local_e8;
  ulong local_e0;
  undefined1 local_d1;
  string local_d0 [20];
  int32_t in_stack_ffffffffffffff44;
  llama_context *in_stack_ffffffffffffff48;
  value_type vVar15;
  vector<int,_std::allocator<int>_> local_a8;
  int32_t local_90;
  undefined1 local_89;
  string local_88 [32];
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [24];
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reading state\n");
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading model info\n","state_read_data");
  llm_arch_name(in_stack_fffffffffffffe9c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (allocator<char> *)in_stack_fffffffffffffec0);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string(local_68);
  llama_io_read_i::read_string
            ((llama_io_read_i *)in_stack_fffffffffffffea0,
             (string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  bVar1 = std::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (bVar1) {
    local_89 = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar5 = std::__cxx11::string::c_str();
    uVar6 = std::__cxx11::string::c_str();
    format_abi_cxx11_((char *)local_88,"wrong model arch: \'%s\' instead of \'%s\'",uVar5,uVar6);
    std::runtime_error::runtime_error(prVar7,local_88);
    local_89 = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading output ids\n","state_read_data");
  local_90 = in_RDI->n_outputs;
  (*in_RSI->_vptr_llama_io_read_i[3])(in_RSI,&local_90,4);
  iVar14 = local_90;
  iVar2 = output_reserve(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  if (iVar2 < iVar14) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"could not reserve outputs");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3df952);
  if (local_90 != 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffeb8 = in_RSI;
    piVar8 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x3df991);
    (*in_stack_fffffffffffffeb8->_vptr_llama_io_read_i[3])
              (in_stack_fffffffffffffeb8,piVar8,(long)local_90 << 2);
    in_stack_fffffffffffffeb4 = 0;
    while( true ) {
      iVar4 = in_stack_fffffffffffffeb4;
      sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_a8);
      if ((int)sVar9 <= in_stack_fffffffffffffeb4) break;
      puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)iVar4);
      uVar12 = *puVar10;
      uVar13 = uVar12;
      uVar3 = n_batch(in_RDI);
      if (uVar3 <= uVar13) {
        local_d1 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar3 = n_batch(in_RDI);
        format_abi_cxx11_((char *)local_d0,"invalid output id, %d does not fit in batch size of %u",
                          (ulong)uVar12,(ulong)uVar3);
        std::runtime_error::runtime_error(prVar7,local_d0);
        local_d1 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      vVar15 = iVar4;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&in_RDI->output_ids,(long)(int)uVar12);
      *pvVar11 = iVar4;
      in_stack_fffffffffffffeb4 = vVar15 + 1;
    }
    in_RDI->n_outputs = local_90;
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffea0);
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading logits\n","state_read_data");
  (*in_RSI->_vptr_llama_io_read_i[3])(in_RSI,&local_e0,8);
  if (in_RDI->logits_size < local_e0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"logits buffer too small");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_e0 != 0) {
    (*in_RSI->_vptr_llama_io_read_i[3])(in_RSI,in_RDI->logits,local_e0 << 2);
  }
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading embeddings\n","state_read_data");
  (*in_RSI->_vptr_llama_io_read_i[3])(in_RSI,&local_e8,8);
  if (in_RDI->embd_size < local_e8) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"embeddings buffer too small");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_e8 != 0) {
    (*in_RSI->_vptr_llama_io_read_i[3])(in_RSI,in_RDI->embd,local_e8 << 2);
  }
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: - reading KV self\n","state_read_data");
  std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::operator->
            ((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
             0x3dfd5e);
  llama_kv_cache_unified::state_read
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  iVar4 = (*in_RSI->_vptr_llama_io_read_i[4])();
  return CONCAT44(extraout_var,iVar4);
}

Assistant:

size_t llama_context::state_read_data(llama_io_read_i & io) {
    LLAMA_LOG_DEBUG("%s: reading state\n", __func__);

    // read model info
    {
        LLAMA_LOG_DEBUG("%s: - reading model info\n", __func__);

        const std::string cur_arch_str = llm_arch_name(model.arch);

        std::string arch_str;
        io.read_string(arch_str);
        if (cur_arch_str != arch_str) {
            throw std::runtime_error(format("wrong model arch: '%s' instead of '%s'", arch_str.c_str(), cur_arch_str.c_str()));
        }
        // TODO: add more info which needs to be identical but which is not verified otherwise
    }

    // read output ids
    {
        LLAMA_LOG_DEBUG("%s: - reading output ids\n", __func__);

        auto n_outputs = this->n_outputs;
        io.read_to(&n_outputs, sizeof(n_outputs));

        if (n_outputs > output_reserve(n_outputs)) {
            throw std::runtime_error("could not reserve outputs");
        }

        std::vector<int32_t> output_pos;

        if (n_outputs) {
            output_pos.resize(n_outputs);
            io.read_to(output_pos.data(), n_outputs * sizeof(int32_t));

            for (int32_t i = 0; i < (int32_t) output_pos.size(); ++i) {
                int32_t id = output_pos[i];
                if ((uint32_t) id >= n_batch()) {
                    throw std::runtime_error(format("invalid output id, %d does not fit in batch size of %u", id, n_batch()));
                }
                this->output_ids[id] = i;
            }

            this->n_outputs = n_outputs;
        }
    }

    // read logits
    {
        LLAMA_LOG_DEBUG("%s: - reading logits\n", __func__);

        uint64_t logits_size;
        io.read_to(&logits_size, sizeof(logits_size));

        if (this->logits_size < logits_size) {
            throw std::runtime_error("logits buffer too small");
        }

        if (logits_size) {
            io.read_to(this->logits, logits_size * sizeof(float));
        }
    }

    // read embeddings
    {
        LLAMA_LOG_DEBUG("%s: - reading embeddings\n", __func__);

        uint64_t embd_size;
        io.read_to(&embd_size, sizeof(embd_size));

        if (this->embd_size < embd_size) {
            throw std::runtime_error("embeddings buffer too small");
        }

        if (embd_size) {
            io.read_to(this->embd, embd_size * sizeof(float));
        }
    }

    LLAMA_LOG_DEBUG("%s: - reading KV self\n", __func__);
    kv_self->state_read(io);

    return io.n_bytes();
}